

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrashX.cpp
# Opt level: O0

HighsStatus
callCrossover(HighsOptions *options,HighsLp *lp,HighsBasis *highs_basis,
             HighsSolution *highs_solution,HighsModelStatus *model_status,HighsInfo *highs_info,
             HighsCallback *highs_callback)

{
  double dVar1;
  double dVar2;
  char cVar3;
  Parameters new_parameters;
  int iVar4;
  uint uVar5;
  HighsStatus HVar6;
  LpSolver *pLVar7;
  vector<char,_std::allocator<char>_> *this;
  double *z;
  reference pvVar8;
  reference __b;
  reference pvVar9;
  reference pvVar10;
  double *pdVar11;
  size_type sVar12;
  double in_RCX;
  long lVar13;
  byte *in_RDX;
  undefined8 *__dest;
  double in_RDI;
  undefined8 *puVar14;
  undefined4 *in_R8;
  long in_R9;
  byte bVar15;
  HighsStatus return_status;
  HighsStatus status;
  Int errflag;
  IpxSolution ipx_solution;
  bool imprecise_solution;
  Info ipx_info;
  Int crossover_status;
  int i_2;
  int p;
  int i_1;
  vector<double,_std::allocator<double>_> slack;
  int i;
  vector<double,_std::allocator<double>_> x;
  Int load_status;
  LpSolver lps;
  Parameters parameters;
  HighsLogOptions *log_options;
  vector<char,_std::allocator<char>_> constraint_type;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> Av;
  vector<double,_std::allocator<double>_> col_ub;
  vector<double,_std::allocator<double>_> col_lb;
  vector<double,_std::allocator<double>_> objective;
  vector<int,_std::allocator<int>_> Ai;
  vector<int,_std::allocator<int>_> Ap;
  double offset;
  Int num_row;
  Int num_col;
  HighsCallback *callback;
  vector<int,_std::allocator<int>_> *pvVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  undefined1 *puVar18;
  vector<char,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffeca8;
  Int in_stack_ffffffffffffecac;
  double *in_stack_ffffffffffffecb0;
  LpSolver *in_stack_ffffffffffffecb8;
  double *in_stack_ffffffffffffecc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffecc8;
  undefined4 in_stack_ffffffffffffecd0;
  Int in_stack_ffffffffffffecd4;
  LpSolver *in_stack_ffffffffffffecd8;
  undefined1 in_stack_ffffffffffffece0 [32];
  LpSolver *in_stack_ffffffffffffed00;
  Int *in_stack_ffffffffffffed08;
  double *in_stack_ffffffffffffed10;
  double *in_stack_ffffffffffffed18;
  char *in_stack_ffffffffffffed20;
  undefined1 in_stack_ffffffffffffed28 [72];
  double *in_stack_ffffffffffffee18;
  double *in_stack_ffffffffffffee20;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee28;
  reference in_stack_ffffffffffffee30;
  LpSolver *in_stack_ffffffffffffee38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee40;
  double *in_stack_ffffffffffffee48;
  Int *in_stack_ffffffffffffee50;
  Int *in_stack_ffffffffffffee58;
  HighsLp *in_stack_ffffffffffffee60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee70;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffee78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffee80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee88;
  undefined4 in_stack_ffffffffffffee90;
  undefined4 in_stack_ffffffffffffee94;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffee98;
  HighsStatus local_1124;
  HighsBasis *in_stack_ffffffffffffef00;
  IpxSolution *in_stack_ffffffffffffef08;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffef10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffef18;
  HighsLp *in_stack_ffffffffffffef20;
  HighsLogOptions *in_stack_ffffffffffffef28;
  HighsSolution *in_stack_ffffffffffffef40;
  uint local_1070;
  int local_fa0;
  uint local_ea4;
  double local_ea0;
  double local_e98;
  int local_e8c;
  int local_e88;
  int local_e84;
  vector<double,_std::allocator<double>_> local_e80;
  int local_e64;
  vector<double,_std::allocator<double>_> local_e60;
  undefined4 local_e48;
  Int local_e44;
  undefined8 local_e40 [24];
  Parameters local_220;
  HighsLogOptions *local_130;
  vector<char,_std::allocator<char>_> local_118;
  undefined1 local_100 [24];
  vector<double,_std::allocator<double>_> local_e8;
  undefined1 local_d0 [72];
  vector<int,_std::allocator<int>_> local_88;
  int local_50;
  int local_4c;
  long local_48;
  undefined4 *local_40;
  double local_38;
  byte *local_30;
  double local_20;
  HighsStatus local_14;
  
  bVar15 = 0;
  pLVar7 = (LpSolver *)&stack0xffffffffffffff90;
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_20 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x74a057);
  pvVar16 = &local_88;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x74a06c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74a081);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74a096);
  callback = (HighsCallback *)local_d0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74a0ab);
  pvVar17 = &local_e8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74a0c0);
  puVar18 = local_100;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74a0d5);
  this_00 = &local_118;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x74a0e5);
  fillInIpxData(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,
                in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,
                (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee38,
                in_stack_ffffffffffffee70,in_stack_ffffffffffffee78,in_stack_ffffffffffffee80,
                in_stack_ffffffffffffee88,
                (vector<double,_std::allocator<double>_> *)
                CONCAT44(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90),
                in_stack_ffffffffffffee98);
  local_130 = (HighsLogOptions *)((long)local_20 + 0x380);
  ipx::Parameters::Parameters(&local_220);
  local_220.super_ipx_parameters.run_crossover = 1;
  local_220.super_ipx_parameters.crash_basis = 1;
  local_220.super_ipx_parameters.display = (ipxint)((*(byte *)((long)local_20 + 0x1d8) & 1) != 0);
  local_220.super_ipx_parameters.debug = 0;
  if (*(int *)((long)local_20 + 0x208) != 2) {
    if (*(int *)((long)local_20 + 0x208) == 1) {
      local_220.super_ipx_parameters.debug = 2;
    }
    else if (*(int *)((long)local_20 + 0x208) == 3) {
      local_220.super_ipx_parameters.debug = 4;
    }
  }
  local_220.super_ipx_parameters.highs_logging = true;
  local_220.super_ipx_parameters.log_options = (HighsLogOptions *)((long)local_20 + 0x380);
  ipx::LpSolver::LpSolver(in_stack_ffffffffffffed00);
  __dest = local_e40;
  memcpy(__dest,&local_220,0xf0);
  puVar14 = (undefined8 *)&stack0xffffffffffffec78;
  for (lVar13 = 0x1e; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar14 = *__dest;
    __dest = __dest + (ulong)bVar15 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
  }
  new_parameters.super_ipx_parameters.logfile = (char *)pvVar16;
  new_parameters.super_ipx_parameters._0_8_ = pLVar7;
  new_parameters.super_ipx_parameters.print_interval = (double)pvVar17;
  new_parameters.super_ipx_parameters.time_limit = (double)puVar18;
  new_parameters.super_ipx_parameters._32_8_ = this_00;
  new_parameters.super_ipx_parameters.scale = in_stack_ffffffffffffeca8;
  new_parameters.super_ipx_parameters.ipm_maxiter = in_stack_ffffffffffffecac;
  new_parameters.super_ipx_parameters.ipm_feasibility_tol = (double)in_stack_ffffffffffffecb0;
  new_parameters.super_ipx_parameters.ipm_optimality_tol = (double)in_stack_ffffffffffffecb8;
  new_parameters.super_ipx_parameters.ipm_drop_primal = (double)in_stack_ffffffffffffecc0;
  new_parameters.super_ipx_parameters.ipm_drop_dual = (double)in_stack_ffffffffffffecc8;
  new_parameters.super_ipx_parameters.kkt_tol._0_4_ = in_stack_ffffffffffffecd0;
  new_parameters.super_ipx_parameters.kkt_tol._4_4_ = in_stack_ffffffffffffecd4;
  new_parameters.super_ipx_parameters._88_8_ = in_stack_ffffffffffffecd8;
  new_parameters.super_ipx_parameters.dependency_tol = (double)in_stack_ffffffffffffece0._0_8_;
  new_parameters.super_ipx_parameters.volume_tol = (double)in_stack_ffffffffffffece0._8_8_;
  new_parameters.super_ipx_parameters.rows_per_slice = in_stack_ffffffffffffece0._16_4_;
  new_parameters.super_ipx_parameters.maxskip_updates = in_stack_ffffffffffffece0._20_4_;
  new_parameters.super_ipx_parameters.lu_kernel = in_stack_ffffffffffffece0._24_4_;
  new_parameters.super_ipx_parameters._124_4_ = in_stack_ffffffffffffece0._28_4_;
  new_parameters.super_ipx_parameters.lu_pivottol = (double)in_stack_ffffffffffffed00;
  new_parameters.super_ipx_parameters._136_8_ = in_stack_ffffffffffffed08;
  new_parameters.super_ipx_parameters.start_crossover_tol = (double)in_stack_ffffffffffffed10;
  new_parameters.super_ipx_parameters.pfeasibility_tol = (double)in_stack_ffffffffffffed18;
  new_parameters.super_ipx_parameters.dfeasibility_tol = (double)in_stack_ffffffffffffed20;
  new_parameters.super_ipx_parameters.debug = in_stack_ffffffffffffed28._0_4_;
  new_parameters.super_ipx_parameters.switchiter = in_stack_ffffffffffffed28._4_4_;
  new_parameters.super_ipx_parameters.stop_at_switch = in_stack_ffffffffffffed28._8_4_;
  new_parameters.super_ipx_parameters.update_heuristic = in_stack_ffffffffffffed28._12_4_;
  new_parameters.super_ipx_parameters.maxpasses = in_stack_ffffffffffffed28._16_4_;
  new_parameters.super_ipx_parameters.run_centring = in_stack_ffffffffffffed28._20_4_;
  new_parameters.super_ipx_parameters.max_centring_steps = in_stack_ffffffffffffed28._24_4_;
  new_parameters.super_ipx_parameters._196_4_ = in_stack_ffffffffffffed28._28_4_;
  new_parameters.super_ipx_parameters.centring_ratio_tolerance =
       (double)in_stack_ffffffffffffed28._32_8_;
  new_parameters.super_ipx_parameters.centring_ratio_reduction =
       (double)in_stack_ffffffffffffed28._40_8_;
  new_parameters.super_ipx_parameters.centring_alpha_scaling =
       (double)in_stack_ffffffffffffed28._48_8_;
  new_parameters.super_ipx_parameters.bad_products_tolerance = in_stack_ffffffffffffed28._56_4_;
  new_parameters.super_ipx_parameters.highs_logging = (bool)in_stack_ffffffffffffed28[0x3c];
  new_parameters.super_ipx_parameters.timeless_log = (bool)in_stack_ffffffffffffed28[0x3d];
  new_parameters.super_ipx_parameters._230_2_ = in_stack_ffffffffffffed28._62_2_;
  new_parameters.super_ipx_parameters.log_options =
       (HighsLogOptions *)in_stack_ffffffffffffed28._64_8_;
  ipx::LpSolver::SetParameters((LpSolver *)0x74a2a6,new_parameters);
  ipx::LpSolver::SetCallback(pLVar7,callback);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x74a2ec);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x74a301);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x74a316);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x74a339);
  pLVar7 = (LpSolver *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x74a34e);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x74a363);
  this = (vector<char,_std::allocator<char>_> *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x74a378);
  z = (double *)
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x74a388);
  local_e44 = ipx::LpSolver::LoadModel
                        (in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4,
                         (double)in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0,
                         (double *)in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0,
                         in_stack_ffffffffffffecac,(Int *)in_stack_ffffffffffffed00,
                         in_stack_ffffffffffffed08,in_stack_ffffffffffffed10,
                         in_stack_ffffffffffffed18,in_stack_ffffffffffffed20);
  if (local_e44 == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
               in_stack_ffffffffffffecc8);
    for (local_e64 = 0; local_e64 < local_4c; local_e64 = local_e64 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_e60,(long)local_e64);
      __b = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(local_d0 + 0x18),(long)local_e64)
      ;
      in_stack_ffffffffffffee20 = std::max<double>(pvVar8,__b);
      in_stack_ffffffffffffee20 = (double *)*in_stack_ffffffffffffee20;
      in_stack_ffffffffffffee28 = &local_e60;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_ffffffffffffee28,(long)local_e64);
      *pvVar8 = (value_type)in_stack_ffffffffffffee20;
      in_stack_ffffffffffffee30 =
           std::vector<double,_std::allocator<double>_>::operator[]
                     (in_stack_ffffffffffffee28,(long)local_e64);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_d0,(long)local_e64);
      in_stack_ffffffffffffee38 = (LpSolver *)std::min<double>(in_stack_ffffffffffffee30,pvVar8);
      in_stack_ffffffffffffee18 =
           *(double **)&(in_stack_ffffffffffffee38->control_).parameters_.super_ipx_parameters;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_e60,(long)local_e64);
      *pvVar8 = (value_type)in_stack_ffffffffffffee18;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
               in_stack_ffffffffffffecc8);
    for (local_e84 = 0; local_e84 < local_4c; local_e84 = local_e84 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff90,
                          (long)local_e84);
      for (local_e88 = *pvVar9; iVar4 = local_e88,
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff90,
                              (long)(local_e84 + 1)), iVar4 < *pvVar9; local_e88 = local_e88 + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_e8,(long)local_e88)
        ;
        dVar1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e60,(long)local_e84);
        dVar2 = *pvVar8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_e88);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_e80,(long)*pvVar9);
        *pvVar8 = -dVar1 * dVar2 + *pvVar8;
      }
    }
    for (local_e8c = 0; local_e8c < local_50; local_e8c = local_e8c + 1) {
      pvVar10 = std::vector<char,_std::allocator<char>_>::operator[](&local_118,(long)local_e8c);
      cVar3 = *pvVar10;
      if (cVar3 == '<') {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e80,(long)local_e8c);
        local_e98 = 0.0;
        pdVar11 = std::max<double>(pvVar8,&local_e98);
        dVar1 = *pdVar11;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e80,(long)local_e8c);
        *pvVar8 = dVar1;
      }
      else if (cVar3 == '=') {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e80,(long)local_e8c);
        *pvVar8 = 0.0;
      }
      else if (cVar3 == '>') {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e80,(long)local_e8c);
        local_ea0 = 0.0;
        pdVar11 = std::min<double>(pvVar8,&local_ea0);
        dVar1 = *pdVar11;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e80,(long)local_e8c);
        *pvVar8 = dVar1;
      }
    }
    if ((((*(byte *)((long)local_38 + 1) & 1) == 0) ||
        (sVar12 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)((long)local_38 + 0x20)),
        (int)sVar12 != local_4c)) ||
       (sVar12 = std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)((long)local_38 + 0x50)),
       (int)sVar12 != local_50)) {
      highsLogUser(local_130,kInfo,"Calling IPX crossover with only primal values\n");
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74aa0a);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74aa1f);
      local_ea4 = ipx::LpSolver::CrossoverFromStartingPoint
                            (in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                             (double *)in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,
                             in_stack_ffffffffffffee18);
    }
    else {
      highsLogUser(local_130,kInfo,"Calling IPX crossover with primal and dual values\n");
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74a958);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74a96d);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74a986);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x74a99f);
      local_ea4 = ipx::LpSolver::CrossoverFromStartingPoint
                            (in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                             (double *)in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,
                             in_stack_ffffffffffffee18);
    }
    if (local_ea4 == 0) {
      ipx::LpSolver::GetInfo(pLVar7);
      *(int *)(local_48 + 0x20) = local_fa0 + *(int *)(local_48 + 0x20);
      if (((local_1070 == 1) || (local_1070 == 2)) || (local_1070 == 6)) {
        if (local_1070 == 6) {
          *local_40 = 0xd;
          local_14 = kWarning;
          local_e48 = 1;
        }
        else {
          IpxSolution::IpxSolution((IpxSolution *)pLVar7);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this_00,(size_type)z);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this_00,(size_type)z);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this_00,(size_type)z);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this_00,(size_type)z);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)this_00,(size_type)z);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)this_00,(size_type)z);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x74ac2f);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x74ac44);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x74ac59);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x74ac6e);
          std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x74ac83);
          std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x74ac98);
          uVar5 = ipx::LpSolver::GetBasicSolution
                            (in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0,
                             (double *)CONCAT44(in_stack_ffffffffffffecac,in_stack_ffffffffffffeca8)
                             ,(double *)this_00,z,(Int *)this,
                             (Int *)CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0));
          if (uVar5 == 0) {
            HVar6 = ipxBasicSolutionToHighsBasicSolution
                              (in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
                               in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                               in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                               in_stack_ffffffffffffef40);
            if (HVar6 == kOk) {
              *(uint *)(local_48 + 0x34) = (uint)((*local_30 & 1) != 0);
              if (local_1070 != 2) {
                *local_40 = 7;
              }
              else {
                *local_40 = 0xf;
              }
              local_1124 = (HighsStatus)(local_1070 == 2);
              local_14 = local_1124;
            }
            else {
              highsLogUser(local_130,kError,
                           "Failed to convert IPX basic solution to Highs basic solution\n");
              local_14 = kError;
            }
          }
          else {
            highsLogUser(local_130,kError,"IPX crossover getting basic solution: flag = %d\n",
                         (ulong)uVar5);
            local_14 = kError;
          }
          local_e48 = 1;
          IpxSolution::~IpxSolution((IpxSolution *)pLVar7);
        }
      }
      else {
        highsLogUser(local_130,kError,"IPX crossover failed: status = %d\n",(ulong)local_1070);
        local_14 = kError;
        local_e48 = 1;
      }
    }
    else {
      highsLogUser(local_130,kError,"IPX crossover error: flag = %d\n",(ulong)local_ea4);
      local_14 = kError;
      local_e48 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this);
  }
  else {
    highsLogUser(local_130,kError,"Error loading ipx model\n");
    local_14 = kError;
    local_e48 = 1;
  }
  ipx::LpSolver::~LpSolver(pLVar7);
  std::vector<char,_std::allocator<char>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  return local_14;
}

Assistant:

HighsStatus callCrossover(const HighsOptions& options, const HighsLp& lp,
                          HighsBasis& highs_basis,
                          HighsSolution& highs_solution,
                          HighsModelStatus& model_status, HighsInfo& highs_info,
                          HighsCallback& highs_callback) {
  ipx::Int num_col, num_row;
  double offset;
  std::vector<ipx::Int> Ap, Ai;
  std::vector<double> objective, col_lb, col_ub, Av, rhs;
  std::vector<char> constraint_type;

  fillInIpxData(lp, num_col, num_row, offset, objective, col_lb, col_ub, Ap, Ai,
                Av, rhs, constraint_type);
  // if (res != IpxStatus::OK) return HighsStatus::kError;

  const HighsLogOptions& log_options = options.log_options;

  ipx::Parameters parameters;
  parameters.run_crossover = 1;  // 1 = "on"
  parameters.crash_basis = 1;    // 0 = slack basis; 1 = crash basis
  parameters.display = 1;
  if (!options.output_flag) parameters.display = 0;
  // Modify parameters.debug according to log_dev_level
  parameters.debug = 0;
  if (options.log_dev_level == kHighsLogDevLevelDetailed) {
    // Default options.log_dev_level setting is kHighsLogDevLevelNone, yielding
    // default setting debug = 0
  } else if (options.log_dev_level == kHighsLogDevLevelInfo) {
    parameters.debug = 2;
  } else if (options.log_dev_level == kHighsLogDevLevelVerbose) {
    parameters.debug = 4;
  }
  parameters.highs_logging = true;
  parameters.log_options = &options.log_options;

  ipx::LpSolver lps;
  lps.SetParameters(parameters);

  // Set pointer to any callback
  lps.SetCallback(&highs_callback);

  ipx::Int load_status = lps.LoadModel(
      num_col, offset, objective.data(), col_lb.data(), col_ub.data(), num_row,
      Ap.data(), Ai.data(), Av.data(), rhs.data(), constraint_type.data());
  if (load_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Error loading ipx model\n");
    return HighsStatus::kError;
  }

  // Set x values within bounds.
  std::vector<double> x(highs_solution.col_value);
  for (int i = 0; i < num_col; i++) {
    x[i] = std::max(x[i], col_lb[i]);
    x[i] = std::min(x[i], col_ub[i]);
  }

  // Build slack variables from rhs-A*x but subject to sign conditions.
  std::vector<double> slack(rhs);
  for (int i = 0; i < num_col; i++) {
    for (int p = Ap[i]; p < Ap[i + 1]; ++p) slack[Ai[p]] -= Av[p] * x[i];
  }
  for (int i = 0; i < num_row; i++) {
    switch (constraint_type[i]) {
      case '=':
        slack[i] = 0.0;
        break;
      case '<':
        slack[i] = std::max(slack[i], 0.0);
        break;
      case '>':
        slack[i] = std::min(slack[i], 0.0);
        break;
    }
  }
  ipx::Int crossover_status;
  if (highs_solution.dual_valid &&
      (HighsInt)highs_solution.col_dual.size() == num_col &&
      (HighsInt)highs_solution.row_dual.size() == num_row) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with primal and dual values\n");
    crossover_status = lps.CrossoverFromStartingPoint(
        x.data(), slack.data(), highs_solution.row_dual.data(),
        highs_solution.col_dual.data());
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Calling IPX crossover with only primal values\n");
    crossover_status = lps.CrossoverFromStartingPoint(x.data(), slack.data(),
                                                      nullptr, nullptr);
  }

  if (crossover_status != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover error: flag = %d\n", (int)crossover_status);
    return HighsStatus::kError;
  }
  ipx::Info ipx_info = lps.GetInfo();
  highs_info.crossover_iteration_count += (HighsInt)ipx_info.updates_crossover;
  const bool imprecise_solution =
      ipx_info.status_crossover == IPX_STATUS_imprecise;
  if (ipx_info.status_crossover != IPX_STATUS_optimal &&
      ipx_info.status_crossover != IPX_STATUS_imprecise &&
      ipx_info.status_crossover != IPX_STATUS_time_limit) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover failed: status = %d\n",
                 (int)ipx_info.status_crossover);
    return HighsStatus::kError;
  }
  if (ipx_info.status_crossover == IPX_STATUS_time_limit) {
    model_status = HighsModelStatus::kTimeLimit;
    return HighsStatus::kWarning;
  }

  // Get basis
  IpxSolution ipx_solution;
  ipx_solution.num_col = num_col;
  ipx_solution.num_row = num_row;
  ipx_solution.ipx_col_value.resize(num_col);
  ipx_solution.ipx_row_value.resize(num_row);
  ipx_solution.ipx_col_dual.resize(num_col);
  ipx_solution.ipx_row_dual.resize(num_row);
  ipx_solution.ipx_row_status.resize(num_row);
  ipx_solution.ipx_col_status.resize(num_col);
  ipx::Int errflag = lps.GetBasicSolution(
      ipx_solution.ipx_col_value.data(), ipx_solution.ipx_row_value.data(),
      ipx_solution.ipx_row_dual.data(), ipx_solution.ipx_col_dual.data(),
      ipx_solution.ipx_row_status.data(), ipx_solution.ipx_col_status.data());
  if (errflag != 0) {
    highsLogUser(log_options, HighsLogType::kError,
                 "IPX crossover getting basic solution: flag = %d\n",
                 (int)errflag);
    return HighsStatus::kError;
  }

  // Convert the IPX basic solution to a HiGHS basic solution
  HighsStatus status = ipxBasicSolutionToHighsBasicSolution(
      options.log_options, lp, rhs, constraint_type, ipx_solution, highs_basis,
      highs_solution);

  if (status != HighsStatus::kOk) {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Failed to convert IPX basic solution to Highs basic solution\n");
    return HighsStatus::kError;
  }
  highs_info.basis_validity =
      highs_basis.valid ? kBasisValidityValid : kBasisValidityInvalid;
  HighsStatus return_status;
  if (imprecise_solution) {
    model_status = HighsModelStatus::kUnknown;
    return_status = HighsStatus::kWarning;
  } else {
    model_status = HighsModelStatus::kOptimal;
    return_status = HighsStatus::kOk;
  }
  return return_status;
}